

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mecab2njd.c
# Opt level: O2

void mecab2njd(NJD *njd,char **feature,int size)

{
  NJDNode *node;
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)size;
  if (size < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    node = (NJDNode *)calloc(1,0x78);
    NJDNode_initialize(node);
    NJDNode_load(node,feature[uVar2]);
    NJD_push_node(njd,node);
  }
  return;
}

Assistant:

void mecab2njd(NJD * njd, char **feature, int size)
{
   int i;
   NJDNode *node;

   for (i = 0; i < size; i++) {
      node = (NJDNode *) calloc(1, sizeof(NJDNode));
      NJDNode_initialize(node);
      NJDNode_load(node, feature[i]);
      NJD_push_node(njd, node);
   }
}